

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_insert_multiple(planck_unit_test_t *tc)

{
  undefined8 *puVar1;
  planck_unit_result_t pVar2;
  ion_status_t iVar3;
  ion_sl_node_t *cursor;
  int iStack_70;
  ion_status_t status;
  int i;
  ion_byte_t strs [5] [6];
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(strs + 4));
  stack0xffffffffffffff98 = 0x7774000000656e6f;
  strs[0][0] = 'o';
  strs[0][1] = '\0';
  strs[0][2] = '\0';
  strs[0][3] = '\0';
  strs[0][4] = 't';
  strs[0][5] = 'h';
  builtin_memcpy(strs + 1,"ree",4);
  strs[1][4] = 'f';
  strs[1][5] = 'o';
  strs[2][0] = 'u';
  strs[2][1] = 'r';
  strs[2][2] = '\0';
  strs[2][3] = '\0';
  strs[2][4] = 'f';
  strs[2][5] = 'i';
  strs[3][0] = 'v';
  strs[3][1] = 'e';
  strs[3][2] = '\0';
  strs[3][3] = '\0';
  status.error = '\x01';
  status._1_3_ = 0;
  for (; (int)status._0_4_ < 6; status._0_4_ = status._0_4_ + 1) {
    iVar3 = sl_insert((ion_skiplist_t *)(strs + 4),&status,
                      (ion_value_t)((long)&status.count + (long)(status._0_4_ + -1) * 6));
    cursor._4_1_ = iVar3.error;
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(cursor._4_1_ == '\0'),0xe5,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
    iStack_70 = iVar3.count;
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(iStack_70 == 1),0xe6,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar2 == '\0') {
      longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
    }
  }
  puVar1 = (undefined8 *)**(undefined8 **)(skiplist.super._24_8_ + 0x18);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*(int *)*puVar1 == 1),0xf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_str_are_equal
                    (tc,(char *)puVar1[1],"one",0xf1,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  puVar1 = (undefined8 *)**(undefined8 **)(**(long **)(skiplist.super._24_8_ + 0x18) + 0x18);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*(int *)*puVar1 == 2),0xf4,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_str_are_equal
                    (tc,(char *)puVar1[1],"two",0xf5,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  puVar1 = (undefined8 *)
           **(undefined8 **)(**(long **)(**(long **)(skiplist.super._24_8_ + 0x18) + 0x18) + 0x18);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*(int *)*puVar1 == 3),0xf8,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_str_are_equal
                    (tc,(char *)puVar1[1],"three",0xf9,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  puVar1 = (undefined8 *)
           **(undefined8 **)
             (**(long **)(**(long **)(**(long **)(skiplist.super._24_8_ + 0x18) + 0x18) + 0x18) +
             0x18);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*(int *)*puVar1 == 4),0xfc,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_str_are_equal
                    (tc,(char *)puVar1[1],"four",0xfd,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  puVar1 = (undefined8 *)
           **(undefined8 **)
             (**(long **)(**(long **)(**(long **)(**(long **)(skiplist.super._24_8_ + 0x18) + 0x18)
                                     + 0x18) + 0x18) + 0x18);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(*(int *)*puVar1 == 5),0x100,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar2 = planck_unit_assert_str_are_equal
                    (tc,(char *)puVar1[1],"five",0x101,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                    );
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  sl_destroy((ion_skiplist_t *)(strs + 4));
  return;
}

Assistant:

void
test_skiplist_insert_multiple(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t strs[5][6] = {
		"one", "two", "three", "four", "five"
	};

	int i;

	for (i = 1; i <= 5; i++) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, strs[i - 1]);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t *cursor;

	cursor = skiplist.head->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 1);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "one");

	cursor = skiplist.head->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 2);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "two");

	cursor = skiplist.head->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 3);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "three");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 4);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "four");

	cursor = skiplist.head->next[0]->next[0]->next[0]->next[0]->next[0];
	PLANCK_UNIT_ASSERT_TRUE(tc, *((int *) cursor->key) == 5);
	PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) cursor->value, "five");

	sl_destroy(&skiplist);
}